

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status json_array_resize(JSON_Array *array,size_t new_capacity)

{
  void *__dest;
  long in_RSI;
  long in_RDI;
  JSON_Value **new_items;
  JSON_Status local_4;
  
  if (in_RSI == 0) {
    local_4 = -1;
  }
  else {
    __dest = (*parson_malloc)(in_RSI << 3);
    if (__dest == (void *)0x0) {
      local_4 = -1;
    }
    else {
      if ((*(long *)(in_RDI + 8) != 0) && (*(long *)(in_RDI + 0x10) != 0)) {
        memcpy(__dest,*(void **)(in_RDI + 8),*(long *)(in_RDI + 0x10) << 3);
      }
      (*parson_free)(*(void **)(in_RDI + 8));
      *(void **)(in_RDI + 8) = __dest;
      *(long *)(in_RDI + 0x18) = in_RSI;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static JSON_Status json_array_resize(JSON_Array *array, size_t new_capacity) {
    JSON_Value **new_items = NULL;
    if (new_capacity == 0) {
        return JSONFailure;
    }
    new_items = (JSON_Value**)parson_malloc(new_capacity * sizeof(JSON_Value*));
    if (new_items == NULL) {
        return JSONFailure;
    }
    if (array->items != NULL && array->count > 0) {
        memcpy(new_items, array->items, array->count * sizeof(JSON_Value*));
    }
    parson_free(array->items);
    array->items = new_items;
    array->capacity = new_capacity;
    return JSONSuccess;
}